

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNew,int fVerbose)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  Abc_Ntk_t *pAVar6;
  int local_48;
  int local_44;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pModel;
  Gia_Man_t *pGia;
  Vec_Ptr_t *vBuffers;
  Abc_Ntk_t *pAStack_18;
  int fVerbose_local;
  Abc_Ntk_t *pNew_local;
  Abc_Ntk_t *pNtk_local;
  
  vBuffers._4_4_ = fVerbose;
  pAStack_18 = pNew;
  pNew_local = pNtk;
  p = Abc_NtkFlattenHierarchyGia(pNtk,(Vec_Ptr_t **)&pGia,0);
  local_48 = 0;
  iVar1 = Gia_ManPiNum(p);
  iVar2 = Abc_NtkPiNum(pNew_local);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x21f,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar1 = Gia_ManPiNum(p);
  iVar2 = Abc_NtkPiNum(pAStack_18);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x220,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar1 = Gia_ManPoNum(p);
  iVar2 = Abc_NtkPoNum(pNew_local);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x221,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar1 = Gia_ManPoNum(p);
  iVar2 = Abc_NtkPoNum(pAStack_18);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x222,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar1 = Gia_ManBufNum(p);
  iVar2 = Vec_PtrSize((Vec_Ptr_t *)pGia);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManBufNum(pGia) == Vec_PtrSize(vBuffers)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x223,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  iVar1 = Gia_ManBufNum(p);
  if (iVar1 != pAStack_18->nBarBufs2) {
    __assert_fail("Gia_ManBufNum(pGia) == pNew->nBarBufs2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x224,"void Abc_NtkInsertHierarchyGia(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  Gia_ManStop(p);
  if (pNew_local->pDesign == (Abc_Des_t *)0x0) {
    Abc_NtkCleanCopy(pNew_local);
  }
  else {
    for (local_44 = 0; iVar1 = Vec_PtrSize(pNew_local->pDesign->vModules), local_44 < iVar1;
        local_44 = local_44 + 1) {
      pAVar6 = (Abc_Ntk_t *)Vec_PtrEntry(pNew_local->pDesign->vModules,local_44);
      Abc_NtkCleanCopy(pAVar6);
    }
  }
  for (local_44 = 0; iVar1 = Abc_NtkPiNum(pAStack_18), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkPi(pAStack_18,local_44);
    pAVar4 = Abc_NtkPi(pNew_local,local_44);
    (pAVar4->field_6).pCopy = pAVar3;
  }
  for (local_44 = 0; iVar1 = Abc_NtkPoNum(pAStack_18), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkPo(pAStack_18,local_44);
    pAVar4 = Abc_NtkPo(pNew_local,local_44);
    (pAVar4->field_6).pCopy = pAVar3;
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(pAStack_18->vObjs), local_44 < iVar1;
      local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkObj(pAStack_18,local_44);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBarBuf(pAVar3), iVar1 != 0)) {
      pvVar5 = Vec_PtrEntry((Vec_Ptr_t *)pGia,local_48);
      *(Abc_Obj_t **)((long)pvVar5 + 0x40) = pAVar3;
      local_48 = local_48 + 1;
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)pGia);
  Abc_NtkCleanCopy(pAStack_18);
  Gia_ManInsertOne(pNew_local,pAStack_18);
  if (pNew_local->pDesign != (Abc_Des_t *)0x0) {
    for (local_44 = 0; iVar1 = Vec_PtrSize(pNew_local->pDesign->vModules), local_44 < iVar1;
        local_44 = local_44 + 1) {
      pAVar6 = (Abc_Ntk_t *)Vec_PtrEntry(pNew_local->pDesign->vModules,local_44);
      if (pAVar6 != pNew_local) {
        Gia_ManInsertOne(pAVar6,pAStack_18);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkInsertHierarchyGia( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNew, int fVerbose )
{
    Vec_Ptr_t * vBuffers;
    Gia_Man_t * pGia = Abc_NtkFlattenHierarchyGia( pNtk, &vBuffers, 0 );
    Abc_Ntk_t * pModel;  
    Abc_Obj_t * pObj; 
    int i, k = 0;

    assert( Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNtk) );
    assert( Gia_ManPiNum(pGia) == Abc_NtkPiNum(pNew) );
    assert( Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNtk) );
    assert( Gia_ManPoNum(pGia) == Abc_NtkPoNum(pNew) );
    assert( Gia_ManBufNum(pGia) == Vec_PtrSize(vBuffers) );
    assert( Gia_ManBufNum(pGia) == pNew->nBarBufs2 );
    Gia_ManStop( pGia );

    // clean the networks
    if ( !pNtk->pDesign )
        Abc_NtkCleanCopy( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Abc_NtkCleanCopy( pModel );

    // annotate PIs and POs of each network with barbufs
    Abc_NtkForEachPi( pNew, pObj, i )
        Abc_NtkPi(pNtk, i)->pCopy = pObj;
    Abc_NtkForEachPo( pNew, pObj, i )
        Abc_NtkPo(pNtk, i)->pCopy = pObj;
    Abc_NtkForEachBarBuf( pNew, pObj, i )
        ((Abc_Obj_t *)Vec_PtrEntry(vBuffers, k++))->pCopy = pObj;
    Vec_PtrFree( vBuffers );

    // connect each model
    Abc_NtkCleanCopy( pNew );
    Gia_ManInsertOne( pNtk, pNew );
    if ( pNtk->pDesign )
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            if ( pModel != pNtk )
                Gia_ManInsertOne( pModel, pNew );
}